

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::startServerEncryption(TlsCryptographOpenSSL *this)

{
  long lVar1;
  bool bVar2;
  QSslSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  TlsCryptographOpenSSL *in_stack_00000020;
  int in_stack_ffffffffffffff8c;
  SocketError SVar3;
  char *c;
  QSslSocketPrivate *pQVar4;
  int fieldWidth;
  QString *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffb0;
  QChar in_stack_ffffffffffffffde;
  TlsCryptographOpenSSL *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  bVar2 = initSslContext(in_stack_fffffffffffffff0);
  fieldWidth = (int)((ulong)pQVar4 >> 0x20);
  if (bVar2) {
    startHandshake(in_stack_00000020);
    (**(code **)(*(long *)in_RDI + 200))();
  }
  else {
    c = *(char **)(in_RDI + 0x18);
    QSslSocket::tr((char *)in_RDI,c,in_stack_ffffffffffffff8c);
    SVar3 = (SocketError)c;
    QTlsBackendOpenSSL::getErrorsFromOpenSsl();
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffffae,L' ');
    QString::arg<QString,_true>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,fieldWidth,
               in_stack_ffffffffffffffde);
    QTlsPrivate::TlsCryptograph::setErrorAndEmit(in_RDI,SVar3,(QString *)0x14);
    QString::~QString((QString *)0x152522);
    QString::~QString((QString *)0x15252c);
    QString::~QString((QString *)0x152536);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::startServerEncryption()
{
    if (!initSslContext()) {
        Q_ASSERT(d);
        setErrorAndEmit(d, QAbstractSocket::SslInternalError,
                        QSslSocket::tr("Unable to init SSL Context: %1").arg(QTlsBackendOpenSSL::getErrorsFromOpenSsl()));
        return;
    }

    // Start connecting. This will place outgoing data in the BIO, so we
    // follow up with calling transmit().
    startHandshake();
    transmit();
}